

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::MarkRoots
          (Prog *this,SparseArray<int> *rootmap,SparseSet *q,vector<int,_std::allocator<int>_> *stk)

{
  Inst *this_00;
  pointer piVar1;
  bool bVar2;
  uint uVar3;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  int local_34;
  
  SparseArray<int>::set_new(rootmap,0,rootmap->size_);
  bVar2 = SparseArray<int>::has_index(rootmap,this->start_unanchored_);
  if (!bVar2) {
    SparseArray<int>::set_new(rootmap,this->start_unanchored_,rootmap->size_);
  }
  bVar2 = SparseArray<int>::has_index(rootmap,this->start_);
  if (!bVar2) {
    SparseArray<int>::set_new(rootmap,this->start_,rootmap->size_);
  }
  q->size_ = 0;
  piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  local_34 = this->start_unanchored_;
  local_40 = stk;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(stk,&local_34);
switchD_0012b644_caseD_5:
  do {
    piVar1 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar1) {
      return;
    }
    uVar3 = piVar1[-1];
    (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1 + -1;
    while( true ) {
      bVar2 = SparseSet::contains(q,uVar3);
      if (bVar2) break;
      SparseSet::insert_new(q,uVar3);
      this_00 = this->inst_ + (int)uVar3;
      uVar3 = this_00->out_opcode_;
      switch(uVar3 & 7) {
      case 0:
      case 1:
        local_44 = Inst::out1(this_00);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_40,&local_44);
        break;
      default:
        bVar2 = SparseArray<int>::has_index(rootmap,uVar3 >> 4);
        if (!bVar2) {
          SparseArray<int>::set_new(rootmap,this_00->out_opcode_ >> 4,rootmap->size_);
        }
        break;
      case 5:
      case 7:
        goto switchD_0012b644_caseD_5;
      case 6:
        goto switchD_0012b644_caseD_6;
      }
      uVar3 = this_00->out_opcode_;
switchD_0012b644_caseD_6:
      uVar3 = uVar3 >> 4;
    }
  } while( true );
}

Assistant:

void Prog::MarkRoots(SparseArray<int>* rootmap,
                     SparseSet* q, vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  q->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction.
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}